

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O2

unsigned_long __thiscall
strq::Generator<unsigned_long,void>::operator()
          (Generator<unsigned_long,void> *this,
          Arithmetic<std::uniform_int_distribution<unsigned_long>_> schema)

{
  uint uVar1;
  result_type_conflict rVar2;
  mt19937 gen;
  anon_union_5000_2_650ea050_for_random_device_0 local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  std::random_device::random_device((random_device *)&local_2728.field_0);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,(ulong)uVar1);
  std::random_device::~random_device((random_device *)&local_2728.field_0);
  local_2728._M_mt._M_x[0] = schema._dist._M_param._M_a;
  local_2728._M_mt._M_x[1] = schema._dist._M_param._M_b;
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&local_2728.field_0,&local_13a0);
  return rVar2;
}

Assistant:

auto operator()(Arithmetic<Dist> schema) -> T
        {
            std::mt19937 gen{std::random_device{}()};

            if constexpr (std::is_same_v<T, int8_t> ||
                          std::is_same_v<T, uint8_t> ||
                          std::is_same_v<T, char> ||
                          std::is_same_v<T, unsigned char>) {

                return static_cast<T>(random<int>(schema));
            }
            else {
                if constexpr (std::is_same_v<Dist, detail::NoDistribution>) {
                    return std::uniform_int_distribution<T>{}(gen);
                } else {
                    return schema.distribution()(gen);
                }
            }
        }